

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationalBayesEstimatorOnLDA.cpp
# Opt level: O0

void __thiscall
VariationalBayesEstimatorOnLDA::updateHyperParameters(VariationalBayesEstimatorOnLDA *this)

{
  double dVar1;
  reference pvVar2;
  reference this_00;
  type tVar3;
  type tVar4;
  uint local_2c;
  double dStack_28;
  int d_1;
  double numerator;
  int k;
  int d;
  double denominator;
  VariationalBayesEstimatorOnLDA *this_local;
  
  _k = 0.0;
  for (numerator._4_4_ = 0; numerator._4_4_ < this->_D; numerator._4_4_ = numerator._4_4_ + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->_nd,(long)(int)numerator._4_4_);
    tVar3 = boost::math::digamma<double>(*pvVar2 + this->_alphaSum);
    tVar4 = boost::math::digamma<double>(this->_alphaSum);
    _k = (tVar3 - tVar4) + _k;
  }
  for (numerator._0_4_ = 0; numerator._0_4_ < this->_K; numerator._0_4_ = numerator._0_4_ + 1) {
    dStack_28 = 0.0;
    for (local_2c = 0; local_2c < this->_D; local_2c = local_2c + 1) {
      this_00 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[](&this->_ndk,(long)(int)local_2c);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         (this_00,(long)(int)numerator._0_4_);
      dVar1 = *pvVar2;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&this->_alpha,(long)(int)numerator._0_4_);
      tVar3 = boost::math::digamma<double>(dVar1 + *pvVar2);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&this->_alpha,(long)(int)numerator._0_4_);
      tVar4 = boost::math::digamma<double>(*pvVar2);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&this->_alpha,(long)(int)numerator._0_4_);
      dStack_28 = (tVar3 - tVar4) * *pvVar2 + dStack_28;
    }
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->_alpha,(long)(int)numerator._0_4_);
    *pvVar2 = dStack_28 / _k;
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&this->_alphaTimeSeries,&this->_alpha);
  (*this->_vptr_VariationalBayesEstimatorOnLDA[8])(this,0);
  (*this->_vptr_VariationalBayesEstimatorOnLDA[5])();
  return;
}

Assistant:

void VariationalBayesEstimatorOnLDA::updateHyperParameters(){//{{{
    double denominator = 0;
    for(int d=0;d<_D;d++){
        denominator += boost::math::digamma(_nd[d]+_alphaSum) - boost::math::digamma(_alphaSum);
    }
    for(int k=0;k<_K;k++){
        double numerator = 0;
        for(int d=0;d<_D;d++){
            //ndk == 0 -> alphak == 0  digamma(0) - digamma(0) = 0
            try{
                numerator += (boost::math::digamma(_ndk[d][k]+_alpha[k]) - boost::math::digamma(_alpha[k])) * _alpha[k];
            }catch(...){
                numerator += 0;
            }
        }
        _alpha[k] = numerator / denominator;
    }
    _alphaTimeSeries.push_back(_alpha);
    this->updateBeta(SYMMETRY);
    this->calculateHyperParamSum();
}